

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuc_freqs_from_fasta.cpp
# Opt level: O1

void handle_a_sequence(StringBuffer *current_sequence,long *resolutions,long firstSequenceLength)

{
  char *pcVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  
  if (0 < firstSequenceLength) {
    pcVar1 = current_sequence->sData;
    plVar4 = resolutions + 3;
    lVar3 = 0;
    do {
      plVar2 = resolve_char(pcVar1[lVar3],false,true);
      plVar4[-3] = plVar4[-3] + *plVar2;
      plVar4[-2] = plVar4[-2] + plVar2[1];
      plVar4[-1] = plVar4[-1] + plVar2[2];
      *plVar4 = *plVar4 + plVar2[3];
      lVar3 = lVar3 + 1;
      plVar4 = plVar4 + 4;
    } while (firstSequenceLength != lVar3);
  }
  return;
}

Assistant:

void handle_a_sequence (StringBuffer& current_sequence, long * resolutions, const long firstSequenceLength) {
    long resolution_index = 0;
    const unsigned char *s = (const unsigned char *)current_sequence.getString();
    for (long c = 0; c < firstSequenceLength; c++, resolution_index+=4) {
        const long * res = resolve_char(s[c]);
        resolutions [resolution_index] += res[0];
        resolutions [resolution_index+1] += res[1];
        resolutions [resolution_index+2] += res[2];
        resolutions [resolution_index+3] += res[3];
    }
}